

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpMap<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined4 *puVar1;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
  **ppOVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  undefined4 uVar6;
  uint uVar7;
  int v2;
  NodeBase *pNVar8;
  UntypedMapBase *pUVar9;
  long lVar10;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
  *pOVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar14;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  longdouble lVar21;
  bool bVar22;
  uint32_t uVar23;
  uint uVar24;
  uint32_t uVar25;
  uint uVar26;
  MapFieldBaseForParse *this;
  ParseContext *f;
  ParseContext *pPVar27;
  Nonnull<const_char_*> failure_msg;
  ushort *puVar28;
  char *failure_msg_00;
  long lVar29;
  uint7 uVar32;
  ulong uVar30;
  TcParseTableBase *pTVar31;
  uint *puVar33;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *pPVar34;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  ParseContext *extraout_RDX_04;
  ParseContext *pPVar35;
  ParseContext *pPVar36;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar37;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar38;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar39;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar40;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar41;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar42;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar43;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar44;
  char *pcVar45;
  char *pcVar46;
  ParseContext *msg_00;
  ParseContext *table_00;
  ParseContext *entry;
  ParseContext *ctx_00;
  UntypedMapBase *pUVar47;
  int iVar48;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar49;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
  *pOVar50;
  longdouble in_ST0;
  longdouble lVar51;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  FieldAux *aux;
  undefined1 local_c8 [31];
  byte local_a9;
  MessageLite *local_a8;
  TcParseTableBase *local_a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_98;
  uint64_t local_90;
  long local_88;
  ParseContext *local_60;
  FieldEntry *local_58;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_50;
  
  local_a8 = msg;
  local_58 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                       (table,(ulong)data.field_0 >> 0x20);
  local_88 = (long)&table->has_bits_offset + (ulong)local_58->aux_idx * 8 + (ulong)table->aux_offset
  ;
  local_a9 = *(byte *)(local_88 + 4);
  local_a0 = table;
  if (((local_a9 & 1) == 0) || ((data.field_0._0_4_ & 7) != 2)) {
    pcVar45 = MpFallback(local_a8,ptr,ctx,data,table,hasbits);
    return pcVar45;
  }
  uVar6 = *(undefined4 *)
           ((long)&table->has_bits_offset + (ulong)local_58->aux_idx * 8 + (ulong)table->aux_offset)
  ;
  local_90 = hasbits;
  local_60 = ctx;
  if ((local_a9 & 2) == 0) {
    this = RefAt<google::protobuf::internal::MapFieldBaseForParse>(local_a8,(ulong)local_58->offset)
    ;
    f = (ParseContext *)MapFieldBaseForParse::MutableMap(this);
  }
  else {
    f = (ParseContext *)
        RefAt<google::protobuf::internal::UntypedMapBase>(local_a8,(ulong)local_58->offset);
  }
  puVar33._4_1_ = local_a9;
  puVar33._0_4_ = uVar6;
  puVar33._5_3_ = 0;
  paVar42 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_c8;
  local_98 = data.field_0;
  local_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)puVar33;
  do {
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x277ef8;
    pPVar27 = (ParseContext *)UntypedMapBase::AllocNode((UntypedMapBase *)f);
    uVar30 = (ulong)*(ushort *)((long)&(f->super_EpsCopyInputStream).buffer_end_ + 4);
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f =
         (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
          *)(uVar30 - 8);
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->f =
         (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
          *)0x8;
    ppOVar2 = &((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->f;
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x277f34;
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<long,unsigned_long>
                            ((long *)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f,
                             (unsigned_long *)ppOVar2,
                             "node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      pcVar45 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      iVar48 = 0xb2c;
LAB_00278315:
      ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x27831d;
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f,pcVar45
                 ,iVar48,failure_msg);
      ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x278325;
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f);
    }
    (pPVar27->super_EpsCopyInputStream).buffer_end_ = (char *)0x0;
    pcVar45 = (pPVar27->super_EpsCopyInputStream).patch_buffer_ + (uVar30 - 0x30);
    pcVar45[0] = '\0';
    pcVar45[1] = '\0';
    pcVar45[2] = '\0';
    pcVar45[3] = '\0';
    pcVar45[4] = '\0';
    pcVar45[5] = '\0';
    pcVar45[6] = '\0';
    pcVar45[7] = '\0';
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x277f56;
    pcVar45 = (char *)pPVar27;
    UntypedMapBase::
    VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>
              ((UntypedMapBase *)f,(NodeBase *)pPVar27,
               (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
                )f);
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->f =
         (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
          *)f;
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->node =
         (NodeBase **)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->node;
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x90))->this = (UntypedMapBase *)f;
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->this = (UntypedMapBase *)pPVar27;
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f =
         (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
          *)f;
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->node = (NodeBase **)ppOVar2;
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x60))->this =
         (UntypedMapBase *)((long)paVar42 + 0x48);
    ((anon_class_24_3_6b4a22af *)paVar42)->node = (NodeBase **)((long)paVar42 + 0x48);
    pOVar50 = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
               *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->node;
    ((anon_class_24_3_6b4a22af *)paVar42)->this =
         (UntypedMapBase *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f;
    ((anon_class_24_3_6b4a22af *)paVar42)->f = pOVar50;
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x277fa2;
    UntypedMapBase::
    VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)f,*(anon_class_24_3_6b4a22af *)paVar42);
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f =
         (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
          *)ptr;
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x277faf;
    uVar23 = ReadSize((char **)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f);
    pPVar34 = (ParseContext *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f;
    ctx_00 = (ParseContext *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x60))->f;
    if ((pPVar34 == (ParseContext *)0x0) || (ctx_00->depth_ < 1)) {
LAB_0027820b:
      lVar29._0_4_ = (f->super_EpsCopyInputStream).size_;
      lVar29._4_4_ = (f->super_EpsCopyInputStream).limit_;
      if (lVar29 == 0) {
        ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x27821d;
        UntypedMapBase::DeleteNode((UntypedMapBase *)f,(NodeBase *)pPVar27);
        pPVar34 = extraout_RDX_01;
        pcVar45 = (char *)pPVar27;
      }
      pcVar45 = Error((MessageLite *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->f,pcVar45
                      ,pPVar34,(TcFieldData)puVar33,
                      (TcParseTableBase *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->node
                      ,(uint64_t)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->f);
      return pcVar45;
    }
    puVar33._4_4_ = 0;
    puVar33._0_4_ = uVar23;
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x277fdb;
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)ppOVar2,(char *)ctx_00,(int)pPVar34);
    uVar6 = *(undefined4 *)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->f;
    aVar49._0_4_ = ctx_00->depth_ - 1;
    aVar49.data._4_4_ = 0;
    ctx_00->depth_ = aVar49._0_4_;
    pcVar45 = (char *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f;
    pPVar34 = extraout_RDX;
    if ((ParseContext *)pcVar45 == (ParseContext *)0x0) goto LAB_0027820b;
    puVar33 = (uint *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->node;
    ((anon_class_24_3_6b4a22af *)paVar42)->this = (UntypedMapBase *)f;
    table_00 = (ParseContext *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->node;
    entry = (ParseContext *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x60))->node;
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x27801c;
    puVar28 = (ushort *)
              ParseOneMapEntry((NodeBase *)pPVar27,pcVar45,ctx_00,(FieldAux *)puVar33,
                               (TcParseTableBase *)table_00,(FieldEntry *)entry,
                               ((anon_class_24_3_6b4a22af *)paVar42)->this);
    if (puVar28 != (ushort *)0x0) {
      iVar48 = ctx_00->depth_;
      ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x278038;
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (aVar49._0_4_,iVar48,"old_depth == depth_");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        pcVar45 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
        ;
        iVar48 = 0x481;
        goto LAB_00278315;
      }
    }
    ctx_00->depth_ = ctx_00->depth_ + 1;
    *(undefined4 *)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->this = uVar6;
    pcVar45 = (char *)((long)paVar42 + 0x48);
    ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x278058;
    msg_00 = ctx_00;
    bVar22 = EpsCopyInputStream::PopLimit((EpsCopyInputStream *)ctx_00,(LimitToken *)pcVar45);
    pPVar34 = extraout_RDX_00;
    if ((!bVar22) || (puVar28 == (ushort *)0x0)) goto LAB_0027820b;
    pUVar47 = ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->this;
    uVar23 = (uint32_t)pUVar47;
    paVar37 = paVar42;
    if (((ulong)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->this & 0x1000000000000000) ==
        0) {
LAB_002780a6:
      uVar24 = *(uint *)((long)&(f->super_EpsCopyInputStream).buffer_end_ + 4);
      paVar41 = paVar42;
      if (5 < ((byte)(uVar24 >> 0x18) & 0xf)) {
switchD_002780cb_caseD_3:
        *(undefined8 *)((long)paVar41 + -8) = 0x278336;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0xb68);
      }
      uVar24 = uVar24 >> 0x18 & 0xf;
      puVar33 = &switchD_002780cb::switchdataD_00419c04;
      bVar22 = 0xffffffffffbe63fb <
               (ulong)(long)(int)(&switchD_002780cb::switchdataD_00419c04)[uVar24];
      failure_msg_00 =
           (char *)((long)&switchD_002780cb::switchdataD_00419c04 +
                   (long)(int)(&switchD_002780cb::switchdataD_00419c04)[uVar24]);
      pPVar35 = pPVar34;
      pPVar36 = f;
      paVar12 = paVar42;
      paVar13 = paVar42;
      paVar14 = paVar42;
      paVar43 = paVar42;
      paVar15 = paVar42;
      paVar39 = paVar42;
      paVar38 = paVar42;
      paVar40 = paVar42;
      pcVar46 = pcVar45;
      lVar51 = in_ST0;
      lVar16 = in_ST1;
      lVar17 = in_ST2;
      lVar18 = in_ST3;
      lVar19 = in_ST4;
      lVar20 = in_ST5;
      lVar21 = in_ST6;
      switch(uVar24) {
      case 0:
switchD_002780cb_caseD_0:
        *(undefined8 *)((long)paVar37 + -8) = 0x2780d8;
        KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)f,(KeyNode *)pPVar27);
        break;
      case 1:
switchD_002780cb_caseD_1:
        *(undefined8 *)((long)paVar40 + -8) = 0x2780ff;
        KeyMapBase<unsigned_int>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_int> *)f,(KeyNode *)pPVar27);
        paVar37 = paVar40;
        break;
      case 2:
switchD_002780cb_caseD_2:
        *(undefined8 *)((long)paVar38 + -8) = 0x2780e5;
        KeyMapBase<unsigned_long>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_long> *)f,(KeyNode *)pPVar27);
        paVar37 = paVar38;
        break;
      default:
        goto switchD_002780cb_caseD_3;
      case 5:
switchD_002780cb_caseD_5:
        *(undefined8 *)((long)paVar39 + -8) = 0x2780f2;
        KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InsertOrReplaceNode
                  ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)f,(KeyNode *)pPVar27);
        paVar37 = paVar39;
        break;
      case 6:
switchD_002780cb_caseD_6:
        pcVar45 = (char *)pPVar27;
        paVar42 = paVar14;
        LOCK();
        puVar1 = (undefined4 *)((long)&(f->super_EpsCopyInputStream).limit_end_ + 2);
        uVar6 = *puVar1;
        *puVar1 = (int)puVar28;
        puVar28 = (ushort *)CONCAT44((int)((ulong)puVar28 >> 0x20),uVar6);
        UNLOCK();
        *failure_msg_00 = *failure_msg_00 + (char)failure_msg_00;
code_r0x00279721:
        uVar24 = (uint)failure_msg_00 & 0xf;
        puVar33 = &switchD_00279732::switchdataD_00419c1c;
        bVar22 = 0xffffffffffbe63e3 <
                 (ulong)(long)(int)(&switchD_00279732::switchdataD_00419c1c)[uVar24];
        failure_msg_00 =
             (char *)((long)&switchD_00279732::switchdataD_00419c1c +
                     (long)(int)(&switchD_00279732::switchdataD_00419c1c)[uVar24]);
        paVar44 = paVar42;
        pPVar27 = (ParseContext *)pcVar45;
        switch(uVar24) {
        case 0:
          paVar13 = paVar42;
          msg_00 = f;
          lVar51 = in_ST0;
          lVar16 = in_ST1;
          lVar17 = in_ST2;
          lVar18 = in_ST3;
          lVar19 = in_ST4;
          lVar20 = in_ST5;
          lVar21 = in_ST6;
switchD_002780cb_caseD_b:
          in_ST6 = in_ST7;
          in_ST5 = lVar21;
          in_ST4 = lVar20;
          in_ST3 = lVar19;
          in_ST2 = lVar18;
          in_ST1 = lVar17;
          in_ST0 = lVar16;
          paVar42 = paVar13;
          *(short *)((long)puVar33 * 5 + -10) = (short)lVar51;
          *(undefined8 *)((long)paVar42 + -8) = 0x27973f;
          in_ST7 = in_ST6;
          KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)msg_00,(KeyNode *)pcVar45);
          break;
        case 1:
          *(undefined8 *)((long)paVar42 + -8) = 0x279766;
          KeyMapBase<unsigned_int>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_int> *)f,(KeyNode *)pcVar45);
          break;
        case 2:
          paVar12 = paVar42;
          msg_00 = f;
          lVar51 = in_ST0;
          lVar16 = in_ST1;
          lVar17 = in_ST2;
          lVar18 = in_ST3;
          lVar19 = in_ST4;
          lVar20 = in_ST5;
          lVar21 = in_ST6;
switchD_002780cb_caseD_7:
          in_ST6 = in_ST7;
          in_ST5 = lVar21;
          in_ST4 = lVar20;
          in_ST3 = lVar19;
          in_ST2 = lVar18;
          in_ST1 = lVar17;
          in_ST0 = lVar16;
          paVar42 = paVar12;
          *(short *)((long)puVar33 * 5 + -10) = (short)lVar51;
          *(undefined8 *)((long)paVar42 + -8) = 0x27974c;
          in_ST7 = in_ST6;
          KeyMapBase<unsigned_long>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_long> *)msg_00,(KeyNode *)pcVar45);
          break;
        default:
          goto switchD_00279732_caseD_3;
        case 5:
          *(undefined8 *)((long)paVar42 + -8) = 0x279759;
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::InsertOrReplaceNode
                    ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)f,(KeyNode *)pcVar45);
          break;
        case 6:
          do {
            pcVar45 = pcVar46;
            uVar23 = (uint32_t)pUVar47;
            puVar28 = (ushort *)paVar44[1].data;
            paVar37 = paVar44 + 2;
            paVar40 = paVar44 + 2;
            paVar38 = paVar44 + 2;
            paVar41 = paVar44 + 2;
            paVar39 = paVar44 + 2;
            paVar42 = paVar44 + 2;
            paVar43 = paVar44 + 2;
            pPVar35 = pPVar34;
            pPVar36 = f;
            paVar12 = paVar44 + 2;
            paVar13 = paVar44 + 2;
            paVar14 = paVar44 + 2;
            paVar15 = paVar44 + 2;
            pcVar46 = pcVar45;
            aVar49.data = paVar44->data;
            lVar51 = in_ST0;
            lVar16 = in_ST1;
            lVar17 = in_ST2;
            lVar18 = in_ST3;
            lVar19 = in_ST4;
            lVar20 = in_ST5;
            lVar21 = in_ST6;
            switch(failure_msg_00) {
            case (char *)0x2780cd:
              goto switchD_002780cb_caseD_0;
            case (char *)0x2780da:
              goto switchD_002780cb_caseD_2;
            case (char *)0x2780e7:
              goto switchD_002780cb_caseD_5;
            case (char *)0x2780f4:
              goto switchD_002780cb_caseD_1;
            case (char *)0x278325:
              goto switchD_002780cb_caseD_3;
            case (char *)0x27971c:
              goto switchD_002780cb_caseD_6;
            case "\x1a":
              goto switchD_002780cb_caseD_8;
            case (char *)0x279736:
              goto switchD_002780cb_caseD_b;
            case (char *)0x279743:
              goto switchD_002780cb_caseD_7;
            case (char *)0x279974:
              goto switchD_002780cb_caseD_9;
            case (char *)0x279ab7:
switchD_002780cb_caseD_c:
              puVar33 = (uint *)aVar49;
              table_00 = pPVar27;
              pPVar34 = ctx_00;
              out((short)pPVar35,(char)failure_msg_00);
              bVar22 = (undefined1 *)0xffffffffffffffe7 < paVar43;
              f = *(ParseContext **)((long)paVar43 + 0x18);
              ctx_00 = *(ParseContext **)((long)paVar43 + 0x20);
              pUVar47 = *(UntypedMapBase **)((long)paVar43 + 0x28);
              paVar44 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)paVar43 + 0x38);
              pcVar46 = pcVar45;
              entry = pPVar36;
              pPVar27 = *(ParseContext **)((long)paVar43 + 0x30);
              break;
            case (char *)0x279b26:
              goto switchD_002780cb_caseD_e;
            case (char *)0x279b4b:
              goto switchD_002780cb_caseD_f;
            case (char *)0x279b70:
              goto switchD_002780cb_caseD_d;
            }
          } while( true );
        case 7:
          pcVar45 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                              ((MessageLite *)msg_00,pcVar46,pPVar34,(TcFieldData)0x419c1c,
                               (TcParseTableBase *)table_00,(uint64_t)f);
          return pcVar45;
        case 8:
          goto code_r0x00279b4c;
        case 9:
          goto code_r0x00279b71;
        case 10:
          switch((uint)((ulong)msg_00 >> 9) & 3) {
          case 0:
            *(ParseContext **)((long)paVar42 + -8) = f;
            *(undefined8 *)((long)paVar42 + -0x20) = 0x27d16e;
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)((long)paVar42 + -0x18),
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x9c8,"tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr");
            *(code **)((long)paVar42 + -0x20) =
                 absl::lts_20250127::log_internal::Check_EQImpl<int,unsigned_short>;
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)((long)paVar42 + -0x18));
          case 2:
            return (char *)(ParseContext *)pcVar46;
          case 3:
            pcVar46 = (((ParseContext *)pcVar46)->super_EpsCopyInputStream).limit_end_;
          }
          pTVar31 = MessageLite::GetTcParseTable((MessageLite *)pcVar46);
          return (char *)pTVar31;
        case 0xc:
          pcVar46 = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
          ;
        case 0xb:
          pPVar34 = (ParseContext *)0x452;
        case 0xd:
          switchD_00279732::switchdataD_00419c1c =
               (uint)(CONCAT14(bVar22,0xffe5fb18) >> 0x1c) | 0xfcbf6300;
          pcVar45 = (char *)((long)&pPVar34[9].data_.pool + 2);
          *pcVar45 = *pcVar45 + (char)((ulong)f >> 8);
          *(undefined **)((long)paVar42 + -8) = &UNK_0027d125;
          protobuf_assumption_failed((char *)msg_00,pcVar46,(int)pPVar34);
        case 0xe:
          return failure_msg_00;
        case 0xf:
          return failure_msg_00;
        }
        do {
          uVar24 = (uint)pUVar47;
          if ((ctx_00->super_EpsCopyInputStream).limit_end_ <= puVar28) {
            uVar30 = (ulong)*(ushort *)
                             &(((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->f->
                              super_anon_class_8_1_ba1d60bc).map;
            if (uVar30 != 0) {
              ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x27990a;
              puVar33 = RefAt<unsigned_int>(((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->
                                            node,uVar30);
              *puVar33 = *puVar33 | (uint)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->f;
            }
            return (char *)puVar28;
          }
          bVar3 = (byte)*puVar28;
          uVar26 = (uint)bVar3;
          pOVar50 = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                     *)((long)puVar28 + 1);
          if ((char)bVar3 < '\0') {
            uVar32 = (uint7)(((ulong)bVar3 << 0x39) >> 8);
            bVar4 = *(byte *)&(pOVar50->super_anon_class_8_1_ba1d60bc).map;
            lVar29 = CONCAT71(uVar32,bVar4);
            if ((char)bVar4 < '\0') {
              uVar32 = uVar32 >> 7 | (uint7)((ulong)(lVar29 << 0x39) >> 8);
              lVar29 = CONCAT71(uVar32,(byte)puVar28[1]);
              if ((char)(byte)puVar28[1] < '\0') {
                uVar32 = uVar32 >> 7 | (uint7)((ulong)(lVar29 << 0x39) >> 8);
                lVar29 = CONCAT71(uVar32,*(byte *)((long)puVar28 + 3));
                if ((char)*(byte *)((long)puVar28 + 3) < '\0') {
                  uVar32 = uVar32 >> 7 | (uint7)((ulong)(lVar29 << 0x39) >> 8);
                  if ((char)(byte)puVar28[2] < '\0') {
                    uVar26 = 0;
                    pOVar50 = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                               *)0x0;
                  }
                  else {
                    uVar26 = (int)CONCAT71(uVar32,(byte)puVar28[2]) << 0x1c | (uint)(uVar32 >> 0x1c)
                    ;
                    pOVar50 = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                               *)((long)puVar28 + 5);
                  }
                }
                else {
                  uVar26 = (int)lVar29 << 0x15 | (uint)(uVar32 >> 0x23);
                  pOVar50 = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                             *)(puVar28 + 2);
                }
              }
              else {
                uVar26 = (int)lVar29 << 0xe | (uint)(uVar32 >> 0x2a);
                pOVar50 = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                           *)((long)puVar28 + 3);
              }
              uVar24 = (uint)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->this;
            }
            else {
              uVar26 = (int)lVar29 << 7 | (uint)(((ulong)bVar3 << 0x39) >> 0x39);
              pOVar50 = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                         *)(puVar28 + 1);
            }
          }
          if (uVar26 != uVar24) {
            pOVar50 = ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->f;
            uVar24 = (uint)*(byte *)&(pOVar50->super_anon_class_16_2_4417ab01).aux & (uint)*puVar28;
            if ((uVar24 & 7) != 0) {
              ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node =
                   (NodeBase **)&UNK_002799b5;
              protobuf_assumption_failed
                        ("(idx & 7) == 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                         ,0x452);
            }
            uVar30 = (ulong)(uVar24 & 0xfffffff8);
            pcVar45 = (char *)(**(code **)((long)&pOVar50[2].super_anon_class_16_2_4417ab01.aux +
                                          uVar30 * 2))
                                        (((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->node,
                                         puVar28,((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x60)
                                                 )->f,
                                         (ulong)*puVar28 ^
                                         *(ulong *)((long)&pOVar50[2].super_anon_class_16_2_4417ab01
                                                           .map + uVar30 * 2),pOVar50,
                                         ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->f);
            return pcVar45;
          }
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x27955f;
          pcVar45 = (char *)UntypedMapBase::AllocNode((UntypedMapBase *)f);
          uVar30 = (ulong)*(ushort *)((long)&(f->super_EpsCopyInputStream).buffer_end_ + 4);
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f =
               (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                *)(uVar30 - 8);
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->f =
               (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                *)0x8;
          ppOVar2 = &((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->f;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x27959b;
          failure_msg_00 =
               absl::lts_20250127::log_internal::Check_GEImpl<long,unsigned_long>
                         ((long *)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f,
                          (unsigned_long *)ppOVar2,
                          "node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
          if (failure_msg_00 != (Nullable<const_char_*>)0x0) {
            pcVar45 = 
            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
            ;
            f = (ParseContext *)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f;
            iVar48 = 0xb2c;
            goto LAB_0027997c;
          }
          (((ParseContext *)pcVar45)->super_EpsCopyInputStream).buffer_end_ = (char *)0x0;
          pcVar46 = (((ParseContext *)pcVar45)->super_EpsCopyInputStream).patch_buffer_ +
                    (uVar30 - 0x30);
          pcVar46[0] = '\0';
          pcVar46[1] = '\0';
          pcVar46[2] = '\0';
          pcVar46[3] = '\0';
          pcVar46[4] = '\0';
          pcVar46[5] = '\0';
          pcVar46[6] = '\0';
          pcVar46[7] = '\0';
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x2795bd;
          pcVar46 = pcVar45;
          UntypedMapBase::
          VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>
                    ((UntypedMapBase *)f,(NodeBase *)pcVar45,
                     (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
                      )f);
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->f =
               (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                *)f;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->node =
               (NodeBase **)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->node;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x90))->this = (UntypedMapBase *)f;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->this = (UntypedMapBase *)pcVar45;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f =
               (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                *)f;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->node = (NodeBase **)ppOVar2;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x60))->this =
               (UntypedMapBase *)((long)paVar42 + 0x48);
          ((anon_class_24_3_6b4a22af *)paVar42)->node = (NodeBase **)((long)paVar42 + 0x48);
          pOVar11 = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                     *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->node;
          ((anon_class_24_3_6b4a22af *)paVar42)->this =
               (UntypedMapBase *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f;
          ((anon_class_24_3_6b4a22af *)paVar42)->f = pOVar11;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x279609;
          UntypedMapBase::
          VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
                    ((UntypedMapBase *)f,*(anon_class_24_3_6b4a22af *)paVar42);
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f = pOVar50;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x279616;
          uVar23 = ReadSize((char **)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f);
          pPVar27 = (ParseContext *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f;
          ctx_00 = (ParseContext *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x60))->f;
          if ((pPVar27 == (ParseContext *)0x0) || (ctx_00->depth_ < 1)) {
LAB_00279872:
            lVar10._0_4_ = (f->super_EpsCopyInputStream).size_;
            lVar10._4_4_ = (f->super_EpsCopyInputStream).limit_;
            if (lVar10 == 0) {
              ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x279884;
              UntypedMapBase::DeleteNode((UntypedMapBase *)f,(NodeBase *)pcVar45);
              pPVar27 = extraout_RDX_04;
              pcVar46 = pcVar45;
            }
            pcVar45 = Error((MessageLite *)
                            ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->node,pcVar46,
                            pPVar27,(TcFieldData)puVar33,
                            (TcParseTableBase *)
                            ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->f,
                            (uint64_t)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->f);
            return pcVar45;
          }
          puVar33._4_4_ = 0;
          puVar33._0_4_ = uVar23;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x279642;
          EpsCopyInputStream::PushLimit((EpsCopyInputStream *)ppOVar2,(char *)ctx_00,(int)pPVar27);
          uVar6 = *(undefined4 *)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->f;
          iVar48 = ctx_00->depth_ + -1;
          ctx_00->depth_ = iVar48;
          pcVar46 = (char *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f;
          pPVar27 = extraout_RDX_02;
          if ((ParseContext *)pcVar46 == (ParseContext *)0x0) goto LAB_00279872;
          puVar33 = (uint *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->node;
          ((anon_class_24_3_6b4a22af *)paVar42)->this = (UntypedMapBase *)f;
          table_00 = (ParseContext *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->f;
          entry = (ParseContext *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x60))->node;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x279683;
          puVar28 = (ushort *)
                    ParseOneMapEntry((NodeBase *)pcVar45,pcVar46,ctx_00,(FieldAux *)puVar33,
                                     (TcParseTableBase *)table_00,(FieldEntry *)entry,
                                     ((anon_class_24_3_6b4a22af *)paVar42)->this);
          if (puVar28 != (ushort *)0x0) {
            v2 = ctx_00->depth_;
            ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x27969f;
            failure_msg_00 =
                 absl::lts_20250127::log_internal::Check_EQImpl(iVar48,v2,"old_depth == depth_");
            if (failure_msg_00 != (Nullable<const_char_*>)0x0) {
              pcVar45 = 
              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
              ;
              f = (ParseContext *)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->f;
              goto switchD_002780cb_caseD_9;
            }
          }
          ctx_00->depth_ = ctx_00->depth_ + 1;
          *(undefined4 *)&((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x48))->this = uVar6;
          pcVar46 = (char *)((long)paVar42 + 0x48);
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x2796bf;
          msg_00 = ctx_00;
          bVar22 = EpsCopyInputStream::PopLimit((EpsCopyInputStream *)ctx_00,(LimitToken *)pcVar46);
          pPVar27 = extraout_RDX_03;
          if ((!bVar22) || (puVar28 == (ushort *)0x0)) goto LAB_00279872;
          pUVar47 = ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->this;
          pPVar34 = extraout_RDX_03;
          if (((ulong)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->this &
              0x1000000000000000) == 0) goto LAB_0027970d;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x2796e7;
          puVar33 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)f,(NodeBase *)pcVar45);
          uVar24 = *puVar33;
          pNVar8 = ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->node[1];
          pcVar46 = (char *)(long)(short)*(uint *)&pNVar8->next;
          msg_00 = (ParseContext *)(ulong)(*(uint *)&pNVar8->next >> 0x10);
          pPVar34 = (ParseContext *)(((long)(int)uVar24 - (long)pcVar46) - (long)msg_00);
          if ((ParseContext *)((long)(int)uVar24 - (long)pcVar46) < msg_00) goto LAB_0027970d;
          uVar26 = *(uint *)((long)&pNVar8->next + 4);
          pcVar46 = (char *)(ulong)uVar26;
          msg_00 = (ParseContext *)(ulong)(ushort)uVar26;
          if (pPVar34 < msg_00) {
            if ((*(uint *)((long)&pNVar8[1].next + ((ulong)pPVar34 >> 5) * 4) >>
                 ((uint)pPVar34 & 0x1f) & 1) != 0) goto LAB_0027970d;
          }
          else {
            pPVar34 = (ParseContext *)(ulong)(uVar26 >> 0x10);
            pcVar46 = (char *)0x0;
            while (pcVar46 < pPVar34) {
              uVar7 = *(uint *)((long)&pNVar8[1].next +
                               (long)pcVar46 * 4 + (ulong)(uVar26 >> 3 & 0x1ffc));
              msg_00 = (ParseContext *)(ulong)uVar7;
              table_00 = (ParseContext *)(ulong)((int)uVar24 < (int)uVar7);
              pcVar46 = (char *)(((long)pcVar46 * 2 - (long)table_00) + 2);
              if (uVar7 == uVar24) goto LAB_0027970d;
            }
          }
          pTVar31 = (TcParseTableBase *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->f;
          puVar33 = (uint *)((ulong)pUVar47 & 0xffffffff);
          pUVar9 = ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->this;
          ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x2797de;
          WriteMapEntryAsUnknown
                    ((MessageLite *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->node,
                     pTVar31,(UntypedMapBase *)f,(uint32_t)pUVar47,(NodeBase *)pcVar45,
                     SUB85(pUVar9,0));
        } while( true );
      case 7:
        goto switchD_002780cb_caseD_7;
      case 8:
        goto switchD_002780cb_caseD_8;
      case 9:
      case 10:
switchD_002780cb_caseD_9:
        iVar48 = 0x481;
LAB_0027997c:
        *(undefined8 *)((long)paVar42 + -8) = 0x279984;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)f,pcVar45,iVar48,failure_msg_00);
        *(undefined8 *)((long)paVar42 + -8) = 0x27998c;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)f);
      case 0xb:
        goto switchD_002780cb_caseD_b;
      case 0xc:
        goto switchD_002780cb_caseD_c;
      case 0xd:
switchD_002780cb_caseD_d:
        f = entry;
code_r0x00279b71:
        pcVar45 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                            ((MessageLite *)msg_00,pcVar46,pPVar34,(TcFieldData)puVar33,
                             (TcParseTableBase *)table_00,(uint64_t)f);
        return pcVar45;
      case 0xe:
switchD_002780cb_caseD_e:
        pcVar45 = MpRepeatedVarintT<false,bool,(unsigned_short)0>
                            ((MessageLite *)msg_00,pcVar45,pPVar34,(TcFieldData)puVar33,
                             (TcParseTableBase *)table_00,(uint64_t)entry);
        return pcVar45;
      case 0xf:
switchD_002780cb_caseD_f:
        f = entry;
code_r0x00279b4c:
        pcVar45 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)0>
                            ((MessageLite *)msg_00,pcVar46,pPVar34,(TcFieldData)puVar33,
                             (TcParseTableBase *)table_00,(uint64_t)f);
        return pcVar45;
      }
    }
    else {
      ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x278080;
      puVar33 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)f,(NodeBase *)pPVar27);
      uVar24 = *puVar33;
      pNVar8 = ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x30))->node[1];
      pcVar45 = (char *)(long)(short)*(uint *)&pNVar8->next;
      msg_00 = (ParseContext *)(ulong)(*(uint *)&pNVar8->next >> 0x10);
      pPVar34 = (ParseContext *)(((long)(int)uVar24 - (long)pcVar45) - (long)msg_00);
      if ((ParseContext *)((long)(int)uVar24 - (long)pcVar45) < msg_00) goto LAB_002780a6;
      uVar26 = *(uint *)((long)&pNVar8->next + 4);
      pcVar45 = (char *)(ulong)uVar26;
      msg_00 = (ParseContext *)(ulong)(ushort)uVar26;
      if (msg_00 <= pPVar34) {
        pPVar34 = (ParseContext *)(ulong)(uVar26 >> 0x10);
        pcVar45 = (char *)0x0;
        do {
          if (pPVar34 <= pcVar45) goto LAB_0027815a;
          uVar7 = *(uint *)((long)&pNVar8[1].next +
                           (long)pcVar45 * 4 + (ulong)(uVar26 >> 3 & 0x1ffc));
          msg_00 = (ParseContext *)(ulong)uVar7;
          table_00 = (ParseContext *)(ulong)((int)uVar24 < (int)uVar7);
          pcVar45 = (char *)(((long)pcVar45 * 2 - (long)table_00) + 2);
        } while (uVar7 != uVar24);
        goto LAB_002780a6;
      }
      if ((*(uint *)((long)&pNVar8[1].next + ((ulong)pPVar34 >> 5) * 4) >> ((uint)pPVar34 & 0x1f) &
          1) != 0) goto LAB_002780a6;
LAB_0027815a:
      pOVar50 = ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->f;
      puVar33 = (uint *)((ulong)pUVar47 & 0xffffffff);
      pUVar47 = ((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x78))->this;
      ((anon_class_24_3_6b4a22af *)((long)paVar42 + -0x18))->node = (NodeBase **)0x278177;
      WriteMapEntryAsUnknown
                ((MessageLite *)pOVar50,
                 (TcParseTableBase *)((anon_class_24_3_6b4a22af *)((long)paVar42 + 0x18))->node,
                 (UntypedMapBase *)f,uVar23,(NodeBase *)pPVar27,SUB85(pUVar47,0));
    }
    if ((ctx_00->super_EpsCopyInputStream).limit_end_ <= puVar28) {
      uVar5 = **(ushort **)((long)paVar37 + 0x28);
      if ((ulong)uVar5 != 0) {
        *(undefined8 *)((long)paVar37 + -8) = 0x2782a3;
        puVar33 = RefAt<unsigned_int>(*(void **)((long)paVar37 + 0x20),(ulong)uVar5);
        *puVar33 = *puVar33 | (uint)*(undefined8 *)((long)paVar37 + 0x38);
      }
      return (char *)puVar28;
    }
    bVar3 = (byte)*puVar28;
    uVar25 = (uint32_t)bVar3;
    ptr = (char *)((long)puVar28 + 1);
    if ((char)bVar3 < '\0') {
      uVar32 = (uint7)(((ulong)bVar3 << 0x39) >> 8);
      bVar4 = *(byte *)&(((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                           *)ptr)->super_anon_class_8_1_ba1d60bc).map;
      lVar29 = CONCAT71(uVar32,bVar4);
      if ((char)bVar4 < '\0') {
        uVar32 = uVar32 >> 7 | (uint7)((ulong)(lVar29 << 0x39) >> 8);
        lVar29 = CONCAT71(uVar32,(byte)puVar28[1]);
        if ((char)(byte)puVar28[1] < '\0') {
          uVar32 = uVar32 >> 7 | (uint7)((ulong)(lVar29 << 0x39) >> 8);
          lVar29 = CONCAT71(uVar32,*(byte *)((long)puVar28 + 3));
          if ((char)*(byte *)((long)puVar28 + 3) < '\0') {
            uVar32 = uVar32 >> 7 | (uint7)((ulong)(lVar29 << 0x39) >> 8);
            if ((char)(byte)puVar28[2] < '\0') {
              uVar25 = 0;
              ptr = (char *)0x0;
            }
            else {
              uVar25 = (int)CONCAT71(uVar32,(byte)puVar28[2]) << 0x1c | (uint)(uVar32 >> 0x1c);
              ptr = (char *)((long)puVar28 + 5);
            }
          }
          else {
            uVar25 = (int)lVar29 << 0x15 | (uint)(uVar32 >> 0x23);
            ptr = (char *)(puVar28 + 2);
          }
        }
        else {
          uVar25 = (int)lVar29 << 0xe | (uint)(uVar32 >> 0x2a);
          ptr = (char *)((long)puVar28 + 3);
        }
        uVar23 = (uint32_t)*(undefined8 *)((long)paVar37 + 0x30);
      }
      else {
        uVar25 = (int)lVar29 << 7 | (uint)(((ulong)bVar3 << 0x39) >> 0x39);
        ptr = (char *)(puVar28 + 1);
      }
    }
    paVar42 = paVar37;
    if (uVar25 != uVar23) {
      lVar29 = *(long *)((long)paVar37 + 0x28);
      uVar24 = (uint)*(byte *)(lVar29 + 8) & (uint)*puVar28;
      if ((uVar24 & 7) != 0) {
        *(code **)((long)paVar37 + -8) = MpVarint<true>;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar30 = (ulong)(uVar24 & 0xfffffff8);
      pcVar45 = (char *)(**(code **)(lVar29 + 0x38 + uVar30 * 2))
                                  (*(undefined8 *)((long)paVar37 + 0x20),puVar28,
                                   *(undefined8 *)((long)paVar37 + 0x68),
                                   (ulong)*puVar28 ^ *(ulong *)(lVar29 + 0x40 + uVar30 * 2),lVar29,
                                   *(undefined8 *)((long)paVar37 + 0x38));
      return pcVar45;
    }
  } while( true );
switchD_002780cb_caseD_8:
  pcVar45 = (char *)pPVar27;
  paVar42 = paVar15;
  failure_msg_00 = (char *)(ulong)(byte)(((char)failure_msg_00 - *failure_msg_00) - bVar22);
  goto code_r0x00279721;
LAB_0027970d:
  uVar24 = *(uint *)((long)&(f->super_EpsCopyInputStream).buffer_end_ + 4);
  failure_msg_00 = (char *)(ulong)(uVar24 >> 0x18);
  if (5 < ((byte)(uVar24 >> 0x18) & 0xf)) {
switchD_00279732_caseD_3:
    *(undefined8 *)((long)paVar42 + -8) = 0x27999d;
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0xb68);
  }
  goto code_r0x00279721;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMap(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // `aux[0]` points into a MapAuxInfo.
  // If we have a message mapped_type aux[1] points into a `create_in_arena`.
  // If we have a validated enum mapped_type aux[1] point into a
  // `enum_data`.
  const auto* aux = table->field_aux(&entry);
  const auto map_info = aux[0].map_info;

  if (ABSL_PREDICT_FALSE(!map_info.is_supported ||
                         (data.tag() & 7) !=
                             WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    PROTOBUF_MUSTTAIL return MpFallback(PROTOBUF_TC_PARAM_PASS);
  }

  // When using LITE, the offset points directly into the Map<> object.
  // Otherwise, it points into a MapField and we must synchronize with
  // reflection. It is done by calling the MutableMap() virtual function on the
  // field's base class.
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  UntypedMapBase& map =
      map_info.use_lite
          ? RefAt<UntypedMapBase>(base, entry.offset)
          : *RefAt<MapFieldBaseForParse>(base, entry.offset).MutableMap();

  const uint32_t saved_tag = data.tag();

  while (true) {
    NodeBase* node = map.AllocNode();
    char* const node_end =
        reinterpret_cast<char*>(node) + map.type_info().node_size;
    void* const node_key = node->GetVoidKey();

    // Due to node alignment we can guarantee that we have at least 8 writable
    // bytes from the key position to the end of the node.
    // We can initialize the first and last 8 bytes, which takes care of all the
    // scalar value types. This makes the VisitXXX calls below faster because
    // the switch is much smaller.
    // Assert this in debug mode, just in case.
    ABSL_DCHECK_GE(node_end - static_cast<char*>(node_key), sizeof(uint64_t));
    memset(node_key, 0, sizeof(uint64_t));
    memset(node_end - sizeof(uint64_t), 0, sizeof(uint64_t));

    map.VisitKey(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    map.VisitValue(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  [&](MessageLite* msg) {
                    aux[1].table->class_data->PlacementNew(msg, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
      return ParseOneMapEntry(node, ptr, ctx, aux, table, entry, map);
    });

    if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
      // Parsing failed. Delete the node that we didn't insert.
      if (map.arena() == nullptr) map.DeleteNode(node);
      PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    if (ABSL_PREDICT_FALSE(
            map_info.value_is_validated_enum &&
            !internal::ValidateEnumInlined(*map.GetValue<int32_t>(node),
                                           aux[1].enum_data))) {
      WriteMapEntryAsUnknown(msg, table, map, saved_tag, node, map_info);
    } else {
      // Done parsing the node, insert it.
      switch (map.type_info().key_type_kind()) {
        case UntypedMapBase::TypeKind::kBool:
          static_cast<KeyMapBase<bool>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<bool>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU32:
          static_cast<KeyMapBase<uint32_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint32_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU64:
          static_cast<KeyMapBase<uint64_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint64_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kString:
          static_cast<KeyMapBase<std::string>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<std::string>::KeyNode*>(node));
          break;
        default:
          Unreachable();
      }
    }

    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) {
      PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    uint32_t next_tag;
    const char* ptr2 = ReadTagInlined(ptr, &next_tag);
    if (next_tag != saved_tag) break;
    ptr = ptr2;
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}